

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mioRead.c
# Opt level: O0

Mio_Library_t * Mio_LibraryRead(char *FileName,char *pBuffer,char *ExcludeFile,int fVerbose)

{
  uint uVar1;
  char *pBuffer_00;
  char *pcVar2;
  st__table *local_50;
  st__table *tExcludeGate;
  char *pBufferCopy;
  Mio_Library_t *pMStack_38;
  int num;
  Mio_Library_t *pLib;
  int fVerbose_local;
  char *ExcludeFile_local;
  char *pBuffer_local;
  char *FileName_local;
  
  local_50 = (st__table *)0x0;
  if (ExcludeFile != (char *)0x0) {
    local_50 = st__init_table(strcmp,st__strhash);
    uVar1 = Mio_LibraryReadExclude(ExcludeFile,local_50);
    if (uVar1 == 0xffffffff) {
      st__free_table(local_50);
      return (Mio_Library_t *)0x0;
    }
    fprintf(_stdout,"Read %d gates from exclude file\n",(ulong)uVar1);
  }
  pBuffer_00 = Abc_UtilStrsav(pBuffer);
  if (pBuffer == (char *)0x0) {
    pMStack_38 = Mio_LibraryReadOne(FileName,0,local_50,fVerbose);
  }
  else {
    pMStack_38 = Mio_LibraryReadBuffer(pBuffer,0,local_50,fVerbose);
    if (pMStack_38 != (Mio_Library_t *)0x0) {
      pcVar2 = Extra_FileNameGenericAppend(FileName,".genlib");
      pcVar2 = Abc_UtilStrsav(pcVar2);
      pMStack_38->pName = pcVar2;
    }
  }
  if (pMStack_38 == (Mio_Library_t *)0x0) {
    if (pBuffer == (char *)0x0) {
      pMStack_38 = Mio_LibraryReadOne(FileName,1,local_50,fVerbose);
    }
    else {
      pMStack_38 = Mio_LibraryReadBuffer(pBuffer_00,1,local_50,fVerbose);
      if (pMStack_38 != (Mio_Library_t *)0x0) {
        pcVar2 = Extra_FileNameGenericAppend(FileName,".genlib");
        pcVar2 = Abc_UtilStrsav(pcVar2);
        pMStack_38->pName = pcVar2;
      }
    }
    if (pMStack_38 != (Mio_Library_t *)0x0) {
      printf("Warning: Read extended genlib format but ignoring extensions\n");
    }
  }
  if (pBuffer_00 != (char *)0x0) {
    free(pBuffer_00);
  }
  if (local_50 != (st__table *)0x0) {
    st__free_table(local_50);
  }
  return pMStack_38;
}

Assistant:

Mio_Library_t * Mio_LibraryRead( char * FileName, char * pBuffer, char * ExcludeFile, int fVerbose )
{
    Mio_Library_t * pLib;
    int num;
    char * pBufferCopy;

    st__table * tExcludeGate = 0;

    if ( ExcludeFile )
    {
        tExcludeGate = st__init_table(strcmp, st__strhash);
        if ( (num = Mio_LibraryReadExclude( ExcludeFile, tExcludeGate )) == -1 )
        {
            st__free_table( tExcludeGate );
            tExcludeGate = 0;
            return 0;
        }
        fprintf ( stdout, "Read %d gates from exclude file\n", num );
    }

    pBufferCopy = Abc_UtilStrsav(pBuffer);
    if ( pBuffer == NULL )
        pLib = Mio_LibraryReadOne( FileName, 0, tExcludeGate, fVerbose );       // try normal format first ..
    else
    {
        pLib = Mio_LibraryReadBuffer( pBuffer, 0, tExcludeGate, fVerbose );       // try normal format first ..
        if ( pLib )
            pLib->pName = Abc_UtilStrsav( Extra_FileNameGenericAppend(FileName, ".genlib") );
    }
    if ( pLib == NULL )
    {
        if ( pBuffer == NULL )
            pLib = Mio_LibraryReadOne( FileName, 1, tExcludeGate, fVerbose );       // try normal format first ..
        else
        {
            pLib = Mio_LibraryReadBuffer( pBufferCopy, 1, tExcludeGate, fVerbose );       // try normal format first ..
            if ( pLib )
                pLib->pName = Abc_UtilStrsav( Extra_FileNameGenericAppend(FileName, ".genlib") );
        }
        if ( pLib != NULL )
            printf ( "Warning: Read extended genlib format but ignoring extensions\n" );
    }
    ABC_FREE( pBufferCopy );
    if ( tExcludeGate )
        st__free_table( tExcludeGate );

    return pLib;
}